

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O2

void av1_reset_pmc(PICK_MODE_CONTEXT *ctx)

{
  memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
  memset(ctx->tx_type_map,0,(long)ctx->num_4x4_blk);
  (ctx->rd_stats).rate = 0x7fffffff;
  (ctx->rd_stats).zero_rate = 0;
  (ctx->rd_stats).dist = 0x7fffffffffffffff;
  (ctx->rd_stats).rdcost = 0x7fffffffffffffff;
  (ctx->rd_stats).sse = 0x7fffffffffffffff;
  (ctx->rd_stats).skip_txfm = '\0';
  return;
}

Assistant:

void av1_reset_pmc(PICK_MODE_CONTEXT *ctx) {
  av1_zero_array(ctx->blk_skip, ctx->num_4x4_blk);
  av1_zero_array(ctx->tx_type_map, ctx->num_4x4_blk);
  av1_invalid_rd_stats(&ctx->rd_stats);
}